

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.h
# Opt level: O0

void pbrt::ParallelFor(int64_t start,int64_t end,function<void_(long)> *func)

{
  function<void_(long,_long)> *in_stack_00000080;
  int64_t in_stack_00000088;
  int64_t in_stack_00000090;
  function<void_(long,_long)> *in_stack_ffffffffffffffb0;
  anon_class_8_1_898bcfc2 local_38 [7];
  
  std::function<void(long,long)>::
  function<pbrt::ParallelFor(long,long,std::function<void(long)>)::_lambda(long,long)_1_,void>
            (in_stack_ffffffffffffffb0,local_38);
  ParallelFor(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  std::function<void_(long,_long)>::~function((function<void_(long,_long)> *)0x455d7e);
  return;
}

Assistant:

inline void ParallelFor(int64_t start, int64_t end, std::function<void(int64_t)> func) {
    ParallelFor(start, end, [&func](int64_t start, int64_t end) {
        for (int64_t i = start; i < end; ++i)
            func(i);
    });
}